

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginDefineGroupInst::Exec
          (BeginDefineGroupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  GroupInfo *pGVar3;
  undefined4 *puVar4;
  
  pGVar3 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  if (pGVar3->length == 0xffffffff) {
    pGVar3->offset = *inputOffset;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xad8,"(groupInfo->IsUndefined())","groupInfo->IsUndefined()");
    if (!bVar2) {
LAB_00d4d549:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pGVar3->offset = *inputOffset;
    if (pGVar3->length != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xada,"(groupInfo->IsUndefined())","groupInfo->IsUndefined()");
      if (!bVar2) goto LAB_00d4d549;
      *puVar4 = 0;
    }
  }
  *instPointer = *instPointer + 5;
  return false;
}

Assistant:

inline bool BeginDefineGroupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
        Assert(groupInfo->IsUndefined());
        groupInfo->offset = inputOffset;
        Assert(groupInfo->IsUndefined());

        instPointer += sizeof(*this);
        return false;
    }